

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManUtilSkipSpaces(Psr_Man_t *p)

{
  int iVar1;
  Psr_Man_t *p_local;
  
  while( true ) {
    if (p->pLimit <= p->pCur) {
      iVar1 = Psr_ManErrorSet(p,"Unexpectedly reached end-of-file.",1);
      return iVar1;
    }
    while (iVar1 = Psr_CharIsSpace(*p->pCur), iVar1 != 0) {
      p->pCur = p->pCur + 1;
    }
    if (*p->pCur == '\0') break;
    iVar1 = Psr_ManUtilSkipComments(p);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = Psr_ManErrorSet(p,"Unexpectedly reached end-of-file.",1);
  return iVar1;
}

Assistant:

static inline int Psr_ManUtilSkipSpaces( Psr_Man_t * p )
{
    while ( p->pCur < p->pLimit )
    {
        while ( Psr_CharIsSpace(*p->pCur) ) 
            p->pCur++;
        if ( !*p->pCur )
            return Psr_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
        if ( !Psr_ManUtilSkipComments(p) )
            return 0;
    }
    return Psr_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
}